

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

Array<unsigned_char> * __thiscall
asl::Array<unsigned_char>::append(Array<unsigned_char> *this,Array<unsigned_char> *b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  int local_20;
  int i;
  int n;
  Array<unsigned_char> *b_local;
  Array<unsigned_char> *this_local;
  
  iVar1 = length(this);
  iVar2 = length(this);
  iVar3 = length(b);
  resize(this,iVar2 + iVar3);
  local_20 = 0;
  while( true ) {
    iVar2 = length(b);
    if (iVar2 <= local_20) break;
    puVar4 = operator[](b,local_20);
    this->_a[iVar1 + local_20] = *puVar4;
    local_20 = local_20 + 1;
  }
  return this;
}

Assistant:

Array& append(const Array& b)
	{
		int n=length();
		resize(length()+b.length());
		for (int i=0; i<b.length(); i++)
			_a[n+i] = b[i];
		return *this;
	}